

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O1

void __thiscall
duckdb::PatasScanState<float>::Skip
          (PatasScanState<float> *this,ColumnSegment *segment,idx_t skip_count)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  ulong uVar4;
  
  if ((this->total_value_count != 0) && (uVar1 = this->total_value_count & 0x3ff, uVar1 != 0)) {
    iVar3 = 0x400 - uVar1;
    skip_count = skip_count - iVar3;
    ScanGroup<unsigned_int,true>(this,(uint *)0x0,iVar3);
  }
  if (0x3ff < skip_count) {
    uVar1 = skip_count >> 10;
    pdVar2 = this->metadata_ptr;
    iVar3 = this->total_value_count;
    do {
      uVar4 = this->count - iVar3;
      if (0x3ff < uVar4) {
        uVar4 = 0x400;
      }
      pdVar2 = pdVar2 + (-4 - (ulong)(uint)((int)uVar4 * 2));
      iVar3 = uVar4 + iVar3;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    this->metadata_ptr = pdVar2;
    this->total_value_count = iVar3;
  }
  if ((skip_count & 0x3ff) != 0) {
    ScanGroup<unsigned_int,true>(this,(uint *)0x0,skip_count & 0x3ff);
    return;
  }
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		using EXACT_TYPE = typename FloatingToExact<T>::TYPE;

		if (total_value_count != 0 && !GroupFinished()) {
			// Finish skipping the current group
			idx_t to_skip = LeftInGroup();
			skip_count -= to_skip;
			ScanGroup<EXACT_TYPE, true>(nullptr, to_skip);
		}
		// Figure out how many entire groups we can skip
		// For these groups, we don't even need to process the metadata or values
		idx_t groups_to_skip = skip_count / PatasPrimitives::PATAS_GROUP_SIZE;
		for (idx_t i = 0; i < groups_to_skip; i++) {
			SkipGroup();
		}
		skip_count -= PatasPrimitives::PATAS_GROUP_SIZE * groups_to_skip;
		if (skip_count == 0) {
			return;
		}
		// For the last group that this skip (partially) touches, we do need to
		// load the metadata and values into the group_state
		ScanGroup<EXACT_TYPE, true>(nullptr, skip_count);
	}